

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemSubroutine.cpp
# Opt level: O1

Type * __thiscall
slang::ast::SystemSubroutine::badArg(SystemSubroutine *this,ASTContext *context,Expression *arg)

{
  Diagnostic *pDVar1;
  char *pcVar2;
  bool bVar3;
  string_view arg_00;
  
  pDVar1 = ASTContext::addDiag(context,(DiagCode)0x5000b,arg->sourceRange);
  pDVar1 = ast::operator<<(pDVar1,(arg->type).ptr);
  bVar3 = this->kind != Task;
  pcVar2 = "function";
  if (!bVar3) {
    pcVar2 = "task";
  }
  arg_00._M_str = pcVar2;
  arg_00._M_len = (ulong)bVar3 * 4 + 4;
  Diagnostic::operator<<(pDVar1,arg_00);
  return ((context->scope).ptr)->compilation->errorType;
}

Assistant:

const Type& SystemSubroutine::badArg(const ASTContext& context, const Expression& arg) const {
    context.addDiag(diag::BadSystemSubroutineArg, arg.sourceRange) << *arg.type << kindStr();
    return context.getCompilation().getErrorType();
}